

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadCordFallback
          (EpsCopyInputStream *this,char *ptr,int size,Cord *cord)

{
  int iVar1;
  int v2;
  uint uVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  int *piVar5;
  int local_c0;
  byte local_b9;
  LogMessage local_b8;
  Voidify local_a1;
  string_view local_a0 [2];
  LogMessage local_80;
  Voidify local_69;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int local_58;
  int iStack_54;
  bool in_patch_buf;
  int bytes_from_buffer;
  int new_limit;
  string_view local_48;
  int local_34;
  Cord *pCStack_30;
  int bytes_from_buffer_1;
  Cord *cord_local;
  EpsCopyInputStream *pEStack_20;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  iVar1 = (int)ptr;
  pCStack_30 = cord;
  cord_local._4_4_ = size;
  pEStack_20 = (EpsCopyInputStream *)ptr;
  ptr_local = (char *)this;
  if (this->zcis_ == (ZeroCopyInputStream *)0x0) {
    local_34 = ((int)this->buffer_end_ - iVar1) + 0x10;
    if (local_34 < size) {
      _bytes_from_buffer = cord;
      this_local = (EpsCopyInputStream *)
                   AppendSize<google::protobuf::internal::EpsCopyInputStream::ReadCordFallback(char_const*,int,absl::lts_20250127::Cord*)::__0>
                             (this,ptr,size,(anon_class_8_1_898a5c9c *)&bytes_from_buffer);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,ptr,(long)size);
      absl::lts_20250127::Cord::operator=(pCStack_30,local_48);
      this_local = (EpsCopyInputStream *)((long)pEStack_20 + (long)(int)cord_local._4_4_);
    }
  }
  else {
    iStack_54 = ((int)this->buffer_end_ - iVar1) + this->limit_;
    if (iStack_54 < size) {
      this_local = (EpsCopyInputStream *)0x0;
    }
    else {
      iStack_54 = iStack_54 - size;
      local_58 = ((int)this->buffer_end_ - iVar1) + 0x10;
      absl_log_internal_check_op_result._7_1_ =
           (ulong)((long)ptr - (long)this->patch_buffer_) < 0x21;
      if ((local_58 < 0x21) && ((bool)absl_log_internal_check_op_result._7_1_)) {
        if (((local_58 == 0x10) && (this->next_chunk_ != (char *)0x0)) &&
           (this->next_chunk_ != this->patch_buffer_)) {
          absl::lts_20250127::Cord::Clear(cord);
          StreamBackUp(this,this->size_);
        }
        else {
          cord_local._4_4_ = size - local_58;
          iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(cord_local._4_4_);
          v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
          local_68 = absl::lts_20250127::log_internal::Check_GTImpl(iVar1,v2,"size > 0");
          if (local_68 != (Nullable<const_char_*>)0x0) {
            pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_80,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                       ,0x17e,pcVar3);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_80);
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (local_a0,(char *)pEStack_20,(long)local_58);
          absl::lts_20250127::Cord::operator=(pCStack_30,local_a0[0]);
          if (this->next_chunk_ != this->patch_buffer_) {
            if (this->next_chunk_ == (char *)0x0) {
              SetEndOfStream(this);
              return (char *)0x0;
            }
            local_b9 = 0;
            if (this->size_ < 0x11) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                         ,0x189,"size_ > kSlopBytes");
              local_b9 = 1;
              pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
              absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar4);
            }
            if ((local_b9 & 1) != 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_b8);
            }
            StreamBackUp(this,this->size_ + -0x10);
          }
        }
      }
      else {
        absl::lts_20250127::Cord::Clear(cord);
        StreamBackUp(this,local_58);
      }
      if (this->overall_limit_ < (int)cord_local._4_4_) {
        this_local = (EpsCopyInputStream *)0x0;
      }
      else {
        this->overall_limit_ = this->overall_limit_ - cord_local._4_4_;
        uVar2 = (*this->zcis_->_vptr_ZeroCopyInputStream[6])
                          (this->zcis_,pCStack_30,(ulong)cord_local._4_4_);
        if ((uVar2 & 1) == 0) {
          this_local = (EpsCopyInputStream *)0x0;
        }
        else {
          pEStack_20 = (EpsCopyInputStream *)InitFrom(this,this->zcis_);
          this->limit_ = iStack_54 - ((int)this->buffer_end_ - (int)pEStack_20);
          pcVar3 = this->buffer_end_;
          local_c0 = 0;
          piVar5 = std::min<int>(&local_c0,&this->limit_);
          this->limit_end_ = pcVar3 + *piVar5;
          this_local = pEStack_20;
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::ReadCordFallback(const char* ptr, int size,
                                                 absl::Cord* cord) {
  if (zcis_ == nullptr) {
    int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
    if (size <= bytes_from_buffer) {
      *cord = absl::string_view(ptr, size);
      return ptr + size;
    }
    return AppendSize(ptr, size, [cord](const char* p, int s) {
      cord->Append(absl::string_view(p, s));
    });
  }
  int new_limit = buffer_end_ - ptr + limit_;
  if (size > new_limit) return nullptr;
  new_limit -= size;
  int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
  const bool in_patch_buf = reinterpret_cast<uintptr_t>(ptr) -
                                reinterpret_cast<uintptr_t>(patch_buffer_) <=
                            kPatchBufferSize;
  if (bytes_from_buffer > kPatchBufferSize || !in_patch_buf) {
    cord->Clear();
    StreamBackUp(bytes_from_buffer);
  } else if (bytes_from_buffer == kSlopBytes && next_chunk_ != nullptr &&
             // Only backup if next_chunk_ points to a valid buffer returned by
             // ZeroCopyInputStream. This happens when NextStream() returns a
             // chunk that's smaller than or equal to kSlopBytes.
             next_chunk_ != patch_buffer_) {
    cord->Clear();
    StreamBackUp(size_);
  } else {
    size -= bytes_from_buffer;
    ABSL_DCHECK_GT(size, 0);
    *cord = absl::string_view(ptr, bytes_from_buffer);
    if (next_chunk_ == patch_buffer_) {
      // We have read to end of the last buffer returned by
      // ZeroCopyInputStream. So the stream is in the right position.
    } else if (next_chunk_ == nullptr) {
      // There is no remaining chunks. We can't read size.
      SetEndOfStream();
      return nullptr;
    } else {
      // Next chunk is already loaded
      ABSL_DCHECK(size_ > kSlopBytes);
      StreamBackUp(size_ - kSlopBytes);
    }
  }
  if (size > overall_limit_) return nullptr;
  overall_limit_ -= size;
  if (!zcis_->ReadCord(cord, size)) return nullptr;
  ptr = InitFrom(zcis_);
  limit_ = new_limit - static_cast<int>(buffer_end_ - ptr);
  limit_end_ = buffer_end_ + (std::min)(0, limit_);
  return ptr;
}